

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

HMBool hypermind::addEntry(Entry *entries,HMUINT32 capacity,Value key,Value value)

{
  ValueType VVar1;
  HMObject *pHVar2;
  Entry *pEVar3;
  float fVar4;
  int iVar5;
  anon_union_8_3_be54641b_for_Value_1 aVar6;
  ValueType VVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  float local_40;
  
  aVar6 = key.field_1;
  VVar7 = key.type;
  local_40 = key.field_1._0_4_;
  fVar4 = local_40;
  if (VVar7 == Object) {
    fVar4 = (float)(**(aVar6.objval)->_vptr_HMObject)(aVar6.objval);
  }
  uVar9 = (ulong)(uint)fVar4 % (ulong)capacity;
  VVar1 = entries[uVar9].key.type;
  while( true ) {
    pEVar3 = entries + uVar9;
    if (VVar1 == Undefined) break;
    if (VVar1 == VVar7) {
      switch(VVar1) {
      case Undefined:
      case Null:
      case True:
      case False:
        goto switchD_00113a35_caseD_0;
      case Integer:
        bVar10 = (float)(pEVar3->key).field_1.intval == local_40;
        break;
      case Float:
        bVar10 = -((pEVar3->key).field_1.floatval == local_40) & 1;
        break;
      case Object:
        pHVar2 = (pEVar3->key).field_1.objval;
        if (pHVar2 == aVar6.objval) goto switchD_00113a35_caseD_0;
        iVar5 = (*pHVar2->_vptr_HMObject[3])();
        bVar10 = (byte)iVar5;
        break;
      default:
        goto switchD_00113a35_default;
      }
      if (bVar10 != 0) goto switchD_00113a35_caseD_0;
    }
switchD_00113a35_default:
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
    if (uVar8 == capacity) {
      uVar9 = 0;
    }
    VVar1 = entries[uVar9].key.type;
  }
  (pEVar3->key).type = VVar7;
  (pEVar3->key).field_1.objval = (HMObject *)aVar6;
switchD_00113a35_caseD_0:
  (pEVar3->value).type = value.type;
  (pEVar3->value).field_1 = value.field_1;
  return VVar1 == Undefined;
}

Assistant:

HMBool addEntry(Entry *entries, HMUINT32 capacity, Value key, Value value) {
        uint32_t index = key.hash() % capacity;
        while (true) {
            if (entries[index].key.type == ValueType::Undefined) {
                entries[index].key = key;
                entries[index].value = value;
                return true;       //新的key就返回true
            } else if (entries[index].key.equals(key)) { //key已经存在,仅仅更新值就行
                entries[index].value = value;
                return false;    // 未增加新的key就返回false
            }
            //开放探测定址,尝试下一个slot
            index = (index + 1) % capacity;
        }

    }